

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

parson_bool_t is_decimal(char *string,size_t length)

{
  int iVar1;
  char *pcVar2;
  size_t local_20;
  size_t length_local;
  char *string_local;
  
  if ((((length < 2) || (*string != '0')) || (string[1] == '.')) &&
     (((local_20 = length, length < 3 ||
       (iVar1 = strncmp(string,"-0",2), local_20 = length, iVar1 != 0)) ||
      (local_20 = length, string[2] == '.')))) {
    do {
      if (local_20 == 0) {
        return 1;
      }
      pcVar2 = strchr("xX",(int)string[local_20 - 1]);
      local_20 = local_20 - 1;
    } while (pcVar2 == (char *)0x0);
  }
  return 0;
}

Assistant:

static parson_bool_t is_decimal(const char *string, size_t length) {
    if (length > 1 && string[0] == '0' && string[1] != '.') {
        return PARSON_FALSE;
    }
    if (length > 2 && !strncmp(string, "-0", 2) && string[2] != '.') {
        return PARSON_FALSE;
    }
    while (length--) {
        if (strchr("xX", string[length])) {
            return PARSON_FALSE;
        }
    }
    return PARSON_TRUE;
}